

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O1

void __thiscall
dgrminer::PartialUnion::addLabeledNodeOccurrence
          (PartialUnion *this,size_t node_index,int label,int changetime,
          vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_> *labeled_nodes,
          bool set_of_graphs,int occurrence)

{
  set<int,_std::less<int>,_std::allocator<int>_> *this_00;
  unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this_01;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  __last;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  _Var1;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *p_Var2;
  labeled_node ln;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_false>_>_>
  local_120;
  size_t local_118;
  undefined1 local_110 [8];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_108;
  _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_d8;
  labeled_node local_a0;
  
  local_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_108._M_impl.super__Rb_tree_header._M_header;
  local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  _Var1._M_current =
       (labeled_nodes->
       super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (labeled_nodes->
       super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_a0.label = label;
  local_a0.changetime = changetime;
  local_118 = node_index;
  local_110._0_4_ = changetime;
  local_110._4_4_ = label;
  local_108._M_impl.super__Rb_tree_header._M_header._M_right =
       local_108._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
            (&local_a0.occurrences._M_t,&local_108);
  this_01 = &local_a0.multiple_occurrences;
  local_a0.multiple_occurrences._M_h._M_buckets = (__buckets_ptr)0x0;
  local_a0.multiple_occurrences._M_h._M_bucket_count = local_d8._M_bucket_count;
  local_a0.multiple_occurrences._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a0.multiple_occurrences._M_h._M_element_count = local_d8._M_element_count;
  local_a0.multiple_occurrences._M_h._M_rehash_policy._4_4_ = local_d8._M_rehash_policy._4_4_;
  local_a0.multiple_occurrences._M_h._M_rehash_policy._M_max_load_factor =
       local_d8._M_rehash_policy._M_max_load_factor;
  local_a0.multiple_occurrences._M_h._M_rehash_policy._M_next_resize =
       local_d8._M_rehash_policy._M_next_resize;
  local_a0.multiple_occurrences._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_120._M_h = (__hashtable_alloc *)this_01;
  std::
  _Hashtable<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,false>>>>
            ((_Hashtable<int,std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>,std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,std::__detail::_Select1st,std::equal_to<int>,std::hash<int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)this_01,&local_d8,&local_120);
  _Var1 = std::
          find_if<__gnu_cxx::__normal_iterator<dgrminer::labeled_node*,std::vector<dgrminer::labeled_node,std::allocator<dgrminer::labeled_node>>>,dgrminer::labeled_node>
                    (_Var1,__last,&local_a0);
  std::
  _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&this_01->_M_h);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_a0.occurrences._M_t);
  if (_Var1._M_current ==
      (labeled_nodes->
      super__Vector_base<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    if (this->new_measures == false) {
      if (set_of_graphs) {
        local_120._M_h._0_4_ =
             (this->mappingSnapshotsToGraphs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[occurrence];
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&local_108,(int *)&local_120);
      }
      else {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_108,&occurrence);
      }
    }
    else {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_108,&occurrence);
      p_Var2 = &std::__detail::
                _Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&local_d8,&occurrence)->_M_t;
      local_120._M_h._0_4_ = (int)local_118;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(p_Var2,(int *)&local_120);
    }
    std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::push_back
              (labeled_nodes,(value_type *)local_110);
  }
  else {
    this_00 = &(_Var1._M_current)->occurrences;
    if (this->new_measures == false) {
      if (set_of_graphs) {
        local_120._M_h._0_4_ =
             (this->mappingSnapshotsToGraphs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[occurrence];
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(&this_00->_M_t,(int *)&local_120);
      }
      else {
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   this_00,&occurrence);
      }
    }
    else {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)this_00
                 ,&occurrence);
      p_Var2 = &std::__detail::
                _Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&(_Var1._M_current)->multiple_occurrences,&occurrence)->_M_t;
      local_120._M_h._0_4_ = (int)local_118;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_insert_unique<int>(p_Var2,(int *)&local_120);
    }
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_d8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_108);
  return;
}

Assistant:

void PartialUnion::addLabeledNodeOccurrence(
		size_t node_index,
		int label,
		int changetime,
		std::vector<labeled_node> & labeled_nodes,
		bool set_of_graphs,
		int occurrence
	) {
		labeled_node ln;
		ln.label = label; // nodes[i][PN_LABEL];
		ln.changetime = changetime; // nodes[i][PN_CHANGETIME];
		auto it = std::find_if(labeled_nodes.begin(), labeled_nodes.end(), ln);
		if (it != std::end(labeled_nodes))
		{
		  	if (new_measures) {
			  	it->occurrences.insert(occurrence);
				it->multiple_occurrences[occurrence].insert(node_index);
		  	}
		  	else  {
			  	if (set_of_graphs) {
					it->occurrences.insert(queryMappingSnapshotsToGraphs(occurrence));
				} else {
					it->occurrences.insert(occurrence);
				}
		  	}

		}
		else
		{
		  	if (new_measures) {
			  	ln.occurrences.insert(occurrence);
				ln.multiple_occurrences[occurrence].insert(node_index);
			} else {
			  	if (set_of_graphs) {
					ln.occurrences.insert(queryMappingSnapshotsToGraphs(occurrence));
				} else {
					ln.occurrences.insert(occurrence);
				}
		  	}

			labeled_nodes.push_back(ln);
		}
	}